

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 cr_min,ImVec2 cr_max,bool intersect_with_current_clip_rect)

{
  float fVar1;
  int iVar2;
  ImVec4 *pIVar3;
  ImVec4 *__dest;
  int iVar4;
  int iVar5;
  undefined7 in_register_00000031;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar6 = cr_min.x;
  fVar8 = cr_min.y;
  fVar9 = cr_max.x;
  fVar7 = cr_max.y;
  if ((int)CONCAT71(in_register_00000031,intersect_with_current_clip_rect) != 0) {
    fVar11 = (this->_CmdHeader).ClipRect.x;
    fVar10 = (this->_CmdHeader).ClipRect.y;
    fVar12 = (this->_CmdHeader).ClipRect.z;
    fVar1 = (this->_CmdHeader).ClipRect.w;
    if (fVar11 <= fVar6) {
      fVar11 = fVar6;
    }
    if (fVar10 <= fVar8) {
      fVar10 = fVar8;
    }
    if (fVar9 <= fVar12) {
      fVar12 = fVar9;
    }
    fVar8 = fVar10;
    fVar6 = fVar11;
    fVar9 = fVar12;
    if (fVar1 < fVar7) {
      fVar7 = fVar1;
    }
  }
  iVar5 = (this->_ClipRectStack).Size;
  iVar2 = (this->_ClipRectStack).Capacity;
  if (iVar5 == iVar2) {
    iVar5 = iVar5 + 1;
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar2 < iVar5) {
      __dest = (ImVec4 *)ImGui::MemAlloc((long)iVar5 << 4);
      pIVar3 = (this->_ClipRectStack).Data;
      if (pIVar3 != (ImVec4 *)0x0) {
        memcpy(__dest,pIVar3,(long)(this->_ClipRectStack).Size << 4);
        ImGui::MemFree((this->_ClipRectStack).Data);
      }
      (this->_ClipRectStack).Data = __dest;
      (this->_ClipRectStack).Capacity = iVar5;
    }
  }
  fVar7 = (float)(~-(uint)(fVar7 <= fVar8) & (uint)fVar7 | -(uint)(fVar7 <= fVar8) & (uint)fVar8);
  fVar9 = (float)(~-(uint)(fVar9 <= fVar6) & (uint)fVar9 | -(uint)(fVar9 <= fVar6) & (uint)fVar6);
  pIVar3 = (this->_ClipRectStack).Data;
  iVar5 = (this->_ClipRectStack).Size;
  pIVar3[iVar5].x = fVar6;
  pIVar3[iVar5].y = fVar8;
  pIVar3[iVar5].z = fVar9;
  pIVar3[iVar5].w = fVar7;
  (this->_ClipRectStack).Size = (this->_ClipRectStack).Size + 1;
  (this->_CmdHeader).ClipRect.x = fVar6;
  (this->_CmdHeader).ClipRect.y = fVar8;
  (this->_CmdHeader).ClipRect.z = fVar9;
  (this->_CmdHeader).ClipRect.w = fVar7;
  _OnChangedClipRect(this);
  return;
}

Assistant:

void ImDrawList::PushClipRect(ImVec2 cr_min, ImVec2 cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect)
    {
        ImVec4 current = _CmdHeader.ClipRect;
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    _CmdHeader.ClipRect = cr;
    _OnChangedClipRect();
}